

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_range.cc
# Opt level: O0

void re2c::UTF8splitByRuneLength(RangeSuffix **root,rune l,rune h)

{
  uint32_t n;
  rune h_00;
  undefined4 local_20;
  rune r;
  uint32_t nl;
  uint32_t nh;
  rune h_local;
  rune l_local;
  RangeSuffix **root_local;
  
  n = utf8::rune_length(h);
  local_20 = utf8::rune_length(l);
  nh = l;
  for (; local_20 < n; local_20 = local_20 + 1) {
    h_00 = utf8::max_rune(local_20);
    UTF8splitByContinuity(root,nh,h_00,local_20);
    nh = h_00 + 1;
  }
  UTF8splitByContinuity(root,nh,h,n);
  return;
}

Assistant:

void UTF8splitByRuneLength(RangeSuffix * & root, utf8::rune l, utf8::rune h)
{
	const uint32_t nh = utf8::rune_length(h);
	for (uint32_t nl = utf8::rune_length(l); nl < nh; ++nl)
	{
		utf8::rune r = utf8::max_rune(nl);
		UTF8splitByContinuity(root, l, r, nl);
		l = r + 1;
	}
	UTF8splitByContinuity(root, l, h, nh);
}